

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O2

Expression * __thiscall CFG::LoopShape::Render(LoopShape *this,RelooperBuilder *Builder,bool InLoop)

{
  Shape *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  Loop *Ret;
  Expression *left;
  undefined4 extraout_var_00;
  Block *pBVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  ulong in_R8;
  Name name;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  
  uVar4 = CONCAT71(in_register_00000011,InLoop) & 0xffffffff;
  name = RelooperBuilder::getShapeContinueName(Builder,(this->super_Shape).Id);
  iVar2 = (*this->Inner->_vptr_Shape[2])(this->Inner,Builder,1);
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_R8;
  Ret = ::wasm::Builder::makeLoop
                  (&Builder->super_Builder,name,(Expression *)CONCAT44(extraout_var,iVar2),type_00);
  left = HandleFollowupMultiples((Expression *)Ret,&this->super_Shape,Builder,SUB81(uVar4,0));
  pSVar1 = (this->super_Shape).Next;
  if (pSVar1 != (Shape *)0x0) {
    iVar2 = (*pSVar1->_vptr_Shape[2])(pSVar1,Builder,InLoop);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)uVar4;
    pBVar3 = ::wasm::Builder::makeSequence
                       (&Builder->super_Builder,left,(Expression *)CONCAT44(extraout_var_00,iVar2),
                        type);
    return (Expression *)pBVar3;
  }
  return left;
}

Assistant:

wasm::Expression* LoopShape::Render(RelooperBuilder& Builder, bool InLoop) {
  wasm::Expression* Ret = Builder.makeLoop(Builder.getShapeContinueName(Id),
                                           Inner->Render(Builder, true));
  Ret = HandleFollowupMultiples(Ret, this, Builder, InLoop);
  if (Next) {
    Ret = Builder.makeSequence(Ret, Next->Render(Builder, InLoop));
  }
  return Ret;
}